

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

int sort_5_4::shell_sort_1(int *a,int n,int gap)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = n;
  do {
    do {
      uVar2 = (int)uVar2 / gap;
    } while (n <= (int)uVar2);
    uVar3 = (ulong)uVar2;
    do {
      iVar1 = a[uVar3];
      uVar4 = (int)uVar3 - uVar2;
      do {
        uVar5 = uVar2 + uVar4;
        if (a[uVar4] <= iVar1) goto LAB_00103a7c;
        a[uVar5] = a[uVar4];
        uVar4 = uVar4 - uVar2;
      } while (-1 < (int)uVar4);
      uVar5 = uVar4 + uVar2;
LAB_00103a7c:
      a[(int)uVar5] = iVar1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  } while( true );
}

Assistant:

int shell_sort_1(int *a, int n, int gap = 2) {
        int g = n / gap, j, t;
        while (g > 0) {
            for (int i = g; i < n; i++) {
                t = a[i];
                for (j = i - g; j >= 0 && a[j] > t; j -= g) {
                    a[j + g] = a[j];
                }
                a[j + g] = t;
            }
            g /= gap;
        }
    }